

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O3

int __thiscall glslang::TPpContext::CPPelse(TPpContext *this,int matchelse,TPpToken *ppToken)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  this->inElseSkip = true;
  iVar1 = scanToken(this,ppToken);
  iVar3 = 0;
LAB_004c8bf5:
  do {
    while( true ) {
      do {
        while (iVar1 != 0x23) {
          if (iVar1 == -1) goto LAB_004c8e76;
          while( true ) {
            if (iVar1 == -1) {
              return -1;
            }
            if (iVar1 == 10) break;
            iVar1 = scanToken(this,ppToken);
          }
          iVar1 = scanToken(this,ppToken);
        }
        iVar1 = scanToken(this,ppToken);
      } while (iVar1 != 0xa2);
      iVar2 = TStringAtomMap::getAtom(&this->atomStrings,ppToken->name);
      if (iVar2 - 0xa5U < 3) break;
      if (iVar2 == 0xaa) {
        iVar1 = scanToken(this,ppToken);
        iVar1 = extraTokenCheck(this,0xaa,ppToken,iVar1);
        iVar2 = this->elsetracker;
        this->elseSeen[iVar2] = false;
        this->elsetracker = iVar2 + -1;
        if (iVar3 == 0) {
          if (0 < this->ifdepth) {
            this->ifdepth = this->ifdepth + -1;
          }
          goto LAB_004c8e76;
        }
        iVar3 = iVar3 + -1;
        this->ifdepth = this->ifdepth + -1;
        goto LAB_004c8bf5;
      }
      if (iVar3 == 0 && matchelse != 0) goto LAB_004c8dde;
      iVar1 = 0xa2;
      if (iVar2 == 0xa9) {
        if (this->elseSeen[this->elsetracker] == true) {
          (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                    (this->parseContext,ppToken,"#elif after #else","#elif","");
        }
      }
      else if (iVar2 == 0xa8) {
        if (this->elseSeen[this->elsetracker] == true) {
          (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                    (this->parseContext,ppToken,"#else after #else","#else","");
        }
        else {
          this->elseSeen[this->elsetracker] = true;
        }
        iVar1 = scanToken(this,ppToken);
        iVar1 = extraTokenCheck(this,0xa8,ppToken,iVar1);
      }
    }
    if ((0x40 < this->ifdepth) || (0x40 < this->elsetracker)) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"maximum nesting depth exceeded","#if/#ifdef/#ifndef",""
                );
      return -1;
    }
    iVar3 = iVar3 + 1;
    this->ifdepth = this->ifdepth + 1;
    this->elsetracker = this->elsetracker + 1;
    iVar1 = 0xa2;
  } while( true );
LAB_004c8dde:
  if (iVar2 == 0xa9) {
    if (this->elseSeen[this->elsetracker] == true) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"#elif after #else","#elif","");
    }
    if (0 < this->ifdepth) {
      this->ifdepth = this->ifdepth + -1;
      iVar1 = this->elsetracker;
      this->elseSeen[iVar1] = false;
      this->elsetracker = iVar1 + -1;
    }
    this->inElseSkip = false;
    iVar1 = CPPif(this,ppToken);
    return iVar1;
  }
  iVar1 = 0xa2;
  iVar3 = 0;
  if (iVar2 == 0xa8) {
    this->elseSeen[this->elsetracker] = true;
    iVar1 = scanToken(this,ppToken);
    iVar1 = extraTokenCheck(this,0xa8,ppToken,iVar1);
LAB_004c8e76:
    this->inElseSkip = false;
    return iVar1;
  }
  goto LAB_004c8bf5;
}

Assistant:

int TPpContext::CPPelse(int matchelse, TPpToken* ppToken)
{
    inElseSkip = true;
    int depth = 0;
    int token = scanToken(ppToken);

    while (token != EndOfInput) {
        if (token != '#') {
            while (token != '\n' && token != EndOfInput)
                token = scanToken(ppToken);

            if (token == EndOfInput)
                return token;

            token = scanToken(ppToken);
            continue;
        }

        if ((token = scanToken(ppToken)) != PpAtomIdentifier)
            continue;

        int nextAtom = atomStrings.getAtom(ppToken->name);
        if (nextAtom == PpAtomIf || nextAtom == PpAtomIfdef || nextAtom == PpAtomIfndef) {
            depth++;
            if (ifdepth >= maxIfNesting || elsetracker >= maxIfNesting) {
                parseContext.ppError(ppToken->loc, "maximum nesting depth exceeded", "#if/#ifdef/#ifndef", "");
                return EndOfInput;
            } else {
                ifdepth++;
                elsetracker++;
            }
        } else if (nextAtom == PpAtomEndif) {
            token = extraTokenCheck(nextAtom, ppToken, scanToken(ppToken));
            elseSeen[elsetracker] = false;
            --elsetracker;
            if (depth == 0) {
                // found the #endif we are looking for
                if (ifdepth > 0)
                    --ifdepth;
                break;
            }
            --depth;
            --ifdepth;
        } else if (matchelse && depth == 0) {
            if (nextAtom == PpAtomElse) {
                elseSeen[elsetracker] = true;
                token = extraTokenCheck(nextAtom, ppToken, scanToken(ppToken));
                // found the #else we are looking for
                break;
            } else if (nextAtom == PpAtomElif) {
                if (elseSeen[elsetracker])
                    parseContext.ppError(ppToken->loc, "#elif after #else", "#elif", "");
                /* we decrement ifdepth here, because CPPif will increment
                * it and we really want to leave it alone */
                if (ifdepth > 0) {
                    --ifdepth;
                    elseSeen[elsetracker] = false;
                    --elsetracker;
                }
                inElseSkip = false;
                return CPPif(ppToken);
            }
        } else if (nextAtom == PpAtomElse) {
            if (elseSeen[elsetracker])
                parseContext.ppError(ppToken->loc, "#else after #else", "#else", "");
            else
                elseSeen[elsetracker] = true;
            token = extraTokenCheck(nextAtom, ppToken, scanToken(ppToken));
        } else if (nextAtom == PpAtomElif) {
            if (elseSeen[elsetracker])
                parseContext.ppError(ppToken->loc, "#elif after #else", "#elif", "");
        }
    }
    
    inElseSkip = false;
    return token;
}